

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O2

QRectF * __thiscall
QRasterPaintEngine::clipBoundingRect(QRectF *__return_storage_ptr__,QRasterPaintEngine *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QRasterPaintEnginePrivate *this_00;
  QClipData *pQVar5;
  QRect *r;
  
  this_00 = (QRasterPaintEnginePrivate *)(this->super_QPaintEngineEx).super_QPaintEngine.d_ptr.d;
  pQVar5 = QRasterPaintEnginePrivate::clip(this_00);
  if (pQVar5 == (QClipData *)0x0) {
    r = &this_00->deviceRect;
  }
  else {
    if ((pQVar5->field_0x48 & 2) == 0) {
      iVar1 = pQVar5->xmin;
      iVar2 = pQVar5->xmax;
      iVar3 = pQVar5->ymin;
      iVar4 = pQVar5->ymax;
      __return_storage_ptr__->xp = (double)iVar1;
      __return_storage_ptr__->yp = (double)iVar3;
      __return_storage_ptr__->w = (double)(iVar2 - iVar1);
      __return_storage_ptr__->h = (double)(iVar4 - iVar3);
      return __return_storage_ptr__;
    }
    r = &pQVar5->clipRect;
  }
  QRectF::QRectF(__return_storage_ptr__,r);
  return __return_storage_ptr__;
}

Assistant:

QRectF QRasterPaintEngine::clipBoundingRect() const
{
    Q_D(const QRasterPaintEngine);

    const QClipData *clip = d->clip();

    if (!clip)
        return d->deviceRect;

    if (clip->hasRectClip)
        return clip->clipRect;

    return QRectF(clip->xmin, clip->ymin, clip->xmax - clip->xmin, clip->ymax - clip->ymin);
}